

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O3

void updateZBuffer(int x,int y,Vec3f *points,Vec2f *text,Vec3f *norms,Vec3f *barycenter,
                  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer,
                  vector<float,_std::allocator<float>_> *zBuffer)

{
  pointer pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  pointer pfVar16;
  pointer pVVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  int iVar22;
  TGAColor TVar23;
  undefined3 extraout_var;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  fVar20 = lamp.z;
  fVar19 = lamp.y;
  fVar18 = lamp.x;
  fVar27 = barycenter->x;
  fVar28 = barycenter->y;
  fVar2 = barycenter->z;
  fVar24 = points[2].z * fVar2 + points->z * fVar27 + points[1].z * fVar28;
  fVar30 = norms->x;
  fVar3 = norms->y;
  fVar29 = norms->z;
  fVar4 = norms[1].x;
  fVar5 = norms[1].y;
  fVar6 = norms[1].z;
  fVar7 = norms[2].x;
  fVar8 = norms[2].y;
  fVar9 = norms[2].z;
  fVar10 = text[1].x;
  fVar11 = text->x;
  fVar12 = text[2].x;
  fVar13 = text[1].y;
  fVar14 = text->y;
  fVar15 = text[2].y;
  iVar21 = TGAImage::get_width(&texture);
  iVar22 = TGAImage::get_height(&texture);
  TVar23 = TGAImage::get(&texture,(int)((float)iVar21 *
                                       (fVar12 * fVar2 + fVar11 * fVar27 + fVar10 * fVar28)),
                         (int)((float)iVar22 * (fVar15 * fVar2 + fVar14 * fVar27 + fVar13 * fVar28))
                        );
  iVar21 = y * 0x800 + x;
  pfVar16 = (zBuffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar16[iVar21] <= fVar24) {
    pfVar16[iVar21] = fVar24;
    fVar29 = fVar9 * fVar2 + fVar6 * fVar28 + fVar29 * fVar27;
    fVar30 = fVar7 * fVar2 + fVar4 * fVar28 + fVar30 * fVar27;
    fVar28 = fVar8 * fVar2 + fVar5 * fVar28 + fVar3 * fVar27;
    fVar27 = 1.0 / SQRT(fVar29 * fVar29 + fVar30 * fVar30 + fVar28 * fVar28);
    fVar27 = fVar19 * fVar27 * fVar28 + fVar30 * fVar27 * fVar18 + fVar29 * fVar27 * fVar20;
    auVar26._0_4_ = TVar23.bgra;
    auVar26._4_4_ = (undefined4)(CONCAT35(extraout_var,TVar23) >> 0x20);
    auVar26[8] = auVar26[0];
    auVar26[9] = auVar26[1];
    auVar26[10] = auVar26[2];
    auVar26[0xb] = auVar26[3];
    auVar26._12_4_ = auVar26._4_4_;
    pVVar17 = (framebuffer->super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar21 = x + y * -0x800 + 0x2ff800;
    auVar25._0_4_ = (float)(SUB164(auVar26 & _DAT_00108050,2) & 0xff);
    auVar25._4_4_ = (float)(SUB164(auVar26 & _DAT_00108050,9) & 0xff);
    auVar25._8_8_ = 0;
    auVar26 = divps(auVar25,_DAT_00108070);
    pVVar1 = pVVar17 + iVar21;
    pVVar1->x = fVar27 * auVar26._0_4_;
    pVVar1->y = fVar27 * auVar26._4_4_;
    pVVar17[iVar21].z = ((float)TVar23.bgra[0] / 255.0) * fVar27;
  }
  return;
}

Assistant:

void updateZBuffer(int x, int y, Vec3f points[], Vec2f text[], const Vec3f norms[], const Vec3f &barycenter,
                   std::vector<Vec3f> &framebuffer, std::vector<float> &zBuffer) {
    // bi-linear interpolation to retrieve Z
    float z = points[0].z * barycenter.x + points[1].z * barycenter.y + points[2].z * barycenter.z;

    // getting norm of the current point using bi-linear interpolation between norms of vertices
    Vec3f interNorm = (norms[0] * barycenter.x + norms[1] * barycenter.y + norms[2] * barycenter.z).normalize();
    float illuminate = interNorm*lamp;

    // retrieve position in the texture

    float xText, yText;
    xText = text[0].x * barycenter.x + text[1].x * barycenter.y + text[2].x * barycenter.z;
    yText = text[0].y * barycenter.x + text[1].y * barycenter.y + text[2].y * barycenter.z;
    xText *= (float)(texture.get_width());
    yText = (yText) * (float)(texture.get_height());
    TGAColor textureForThePoint = texture.get((int)xText, (int)(yText));

    //    std::cout << (int) textureForThePoint.bgra[2] << std::endl;
    //    std::cout << (int) textureForThePoint.bgra[1] << std::endl;
    //    std::cout << (int) textureForThePoint.bgra[0] << std::endl;
//        std::cout << illuminate << std::endl;

    // checking z-buffer
    if(z >= zBuffer[y*width + x]){
        zBuffer[y*width + x] = z;
        framebuffer[(height - 1 - y)*width + x] = Vec3f(
                ((float)textureForThePoint.bgra[2]/255)*illuminate,
                ((float)textureForThePoint.bgra[1]/255)*illuminate,
                ((float)textureForThePoint.bgra[0]/255)*illuminate
                );
    }
}